

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_source.cc
# Opt level: O3

void __thiscall
Nanomsg::start(Nanomsg *this,
              shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
              *queue)

{
  thread local_28;
  Nanomsg *local_20;
  code *local_18;
  undefined8 local_10;
  
  *(element_type **)((long)&(this->connect).field_2 + 8) =
       (queue->
       super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->receiveBuffer,
             &(queue->
              super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount);
  local_18 = loop;
  local_10 = 0;
  local_20 = (Nanomsg *)this;
  std::thread::thread<void(Nanomsg::*)(),Nanomsg*,void>
            (&local_28,(offset_in_Nanomsg_to_subr *)&local_18,&local_20);
  if ((this->connect)._M_string_length == 0) {
    (this->connect)._M_string_length = (size_type)local_28._M_id._M_thread;
    pthread_setname_np((pthread_t)local_28._M_id._M_thread,"nanomsg");
    return;
  }
  std::terminate();
}

Assistant:

void Nanomsg::start(const std::shared_ptr<Queue<Samples> >& queue) {
  queue_ = queue;
  thread_ = std::thread(&Nanomsg::loop, this);
#ifdef __APPLE__
  pthread_setname_np("nanomsg");
#else
  pthread_setname_np(thread_.native_handle(), "nanomsg");
#endif
}